

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

bool __thiscall libtorrent::aux::listen_socket_t::can_route(listen_socket_t *this,address *addr)

{
  in6_addr *piVar1;
  sa_family_t sVar2;
  anon_enum_32 aVar3;
  bool bVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bad_address_cast ex;
  address local_30;
  
  bVar5 = true;
  if (((this->flags).m_val & 8) != 0) {
    return true;
  }
  sVar2 = (this->local_endpoint).impl_.data_.base.sa_family;
  aVar3 = addr->type_;
  if ((aVar3 == ipv4) == (sVar2 == 2)) {
    if (sVar2 == 2) {
      local_30.ipv4_address_.addr_.s_addr =
           (in4_addr_type)(this->local_endpoint).impl_.data_.v6.sin6_flowinfo;
      if (aVar3 == ipv4) {
        if (local_30.ipv4_address_.addr_.s_addr == 0 ||
            local_30.ipv4_address_.addr_.s_addr == (in4_addr_type)(addr->ipv4_address_).addr_.s_addr
           ) {
          return true;
        }
      }
      else if (local_30.ipv4_address_.addr_.s_addr == 0) {
        return true;
      }
      local_30.ipv6_address_.addr_.__in6_u = (anon_union_16_3_a3f0114d_for___in6_u)0x0;
      local_30.ipv6_address_.scope_id_ = 0;
      local_30.type_ = ipv4;
    }
    else {
      if (aVar3 != ipv6) {
        local_30._0_8_ = &PTR__bad_cast_004decf0;
        boost::throw_exception<boost::asio::ip::bad_address_cast>((bad_address_cast *)&local_30);
      }
      local_30.ipv6_address_.scope_id_ =
           (unsigned_long)(this->local_endpoint).impl_.data_.v6.sin6_scope_id;
      if ((addr->ipv6_address_).scope_id_ != local_30.ipv6_address_.scope_id_) goto LAB_002b8001;
      auVar6[0] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[0] ==
                   (this->local_endpoint).impl_.data_.base.sa_data[6]);
      auVar6[1] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[1] ==
                   (this->local_endpoint).impl_.data_.base.sa_data[7]);
      auVar6[2] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[2] ==
                   (this->local_endpoint).impl_.data_.base.sa_data[8]);
      auVar6[3] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[3] ==
                   (this->local_endpoint).impl_.data_.base.sa_data[9]);
      auVar6[4] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[4] ==
                   (this->local_endpoint).impl_.data_.base.sa_data[10]);
      auVar6[5] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[5] ==
                   (this->local_endpoint).impl_.data_.base.sa_data[0xb]);
      auVar6[6] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[6] ==
                   (this->local_endpoint).impl_.data_.base.sa_data[0xc]);
      auVar6[7] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[7] ==
                   (this->local_endpoint).impl_.data_.base.sa_data[0xd]);
      auVar6[8] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[8] ==
                   *(uint8_t *)((long)&(this->local_endpoint).impl_.data_ + 0x10));
      auVar6[9] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[9] ==
                   *(uint8_t *)((long)&(this->local_endpoint).impl_.data_ + 0x11));
      auVar6[10] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[10] ==
                    *(uint8_t *)((long)&(this->local_endpoint).impl_.data_ + 0x12));
      auVar6[0xb] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[0xb] ==
                     *(uint8_t *)((long)&(this->local_endpoint).impl_.data_ + 0x13));
      auVar6[0xc] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[0xc] ==
                     *(uint8_t *)((long)&(this->local_endpoint).impl_.data_ + 0x14));
      auVar6[0xd] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[0xd] ==
                     *(uint8_t *)((long)&(this->local_endpoint).impl_.data_ + 0x15));
      auVar6[0xe] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[0xe] ==
                     *(uint8_t *)((long)&(this->local_endpoint).impl_.data_ + 0x16));
      auVar6[0xf] = -((addr->ipv6_address_).addr_.__in6_u.__u6_addr8[0xf] ==
                     *(uint8_t *)((long)&(this->local_endpoint).impl_.data_ + 0x17));
      if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe | (ushort)(auVar6[0xf] >> 7) << 0xf
                  ) == 0xffff) {
        return true;
      }
      piVar1 = &(this->local_endpoint).impl_.data_.v6.sin6_addr;
      auVar7[0] = -((piVar1->__in6_u).__u6_addr8[0] == '\0');
      auVar7[1] = -((this->local_endpoint).impl_.data_.base.sa_data[7] == '\0');
      auVar7[2] = -((this->local_endpoint).impl_.data_.base.sa_data[8] == '\0');
      auVar7[3] = -((this->local_endpoint).impl_.data_.base.sa_data[9] == '\0');
      auVar7[4] = -((this->local_endpoint).impl_.data_.base.sa_data[10] == '\0');
      auVar7[5] = -((this->local_endpoint).impl_.data_.base.sa_data[0xb] == '\0');
      auVar7[6] = -((this->local_endpoint).impl_.data_.base.sa_data[0xc] == '\0');
      auVar7[7] = -((this->local_endpoint).impl_.data_.base.sa_data[0xd] == '\0');
      auVar7[8] = -(*(char *)((long)&(this->local_endpoint).impl_.data_ + 0x10) == '\0');
      auVar7[9] = -(*(char *)((long)&(this->local_endpoint).impl_.data_ + 0x11) == '\0');
      auVar7[10] = -(*(char *)((long)&(this->local_endpoint).impl_.data_ + 0x12) == '\0');
      auVar7[0xb] = -(*(char *)((long)&(this->local_endpoint).impl_.data_ + 0x13) == '\0');
      auVar7[0xc] = -(*(char *)((long)&(this->local_endpoint).impl_.data_ + 0x14) == '\0');
      auVar7[0xd] = -(*(char *)((long)&(this->local_endpoint).impl_.data_ + 0x15) == '\0');
      auVar7[0xe] = -(*(char *)((long)&(this->local_endpoint).impl_.data_ + 0x16) == '\0');
      auVar7[0xf] = -(*(char *)((long)&(this->local_endpoint).impl_.data_ + 0x17) == '\0');
      if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe | (ushort)(auVar7[0xf] >> 7) << 0xf
                  ) == 0xffff) {
        return true;
      }
      local_30.ipv6_address_.addr_.__in6_u.__u6_addr8 = piVar1->__in6_u;
      local_30.ipv4_address_.addr_.s_addr = (in4_addr_type)0;
      local_30.type_ = ipv6;
    }
    bVar4 = match_addr_mask(addr,&local_30,&this->netmask);
    if (!bVar4) {
      bVar5 = ((this->flags).m_val & 2) == 0;
    }
  }
  else {
LAB_002b8001:
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool listen_socket_t::can_route(address const& addr) const
	{
		// if this is a proxy, we assume it can reach everything
		if (flags & proxy) return true;

		if (is_v4(local_endpoint) != addr.is_v4()) return false;

		if (local_endpoint.address().is_v6()
			&& local_endpoint.address().to_v6().scope_id() != addr.to_v6().scope_id())
			return false;

		if (local_endpoint.address() == addr) return true;
		if (local_endpoint.address().is_unspecified()) return true;
		if (match_addr_mask(addr, local_endpoint.address(), netmask)) return true;
		return !(flags & local_network);
	}